

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O3

unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> __thiscall
helics::make_filter(helics *this,FilterTypes type,CoreApp *core,string_view name)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined4 in_register_00000034;
  string_view name_00;
  
  name_00._M_str = (char *)name._M_len;
  peVar1 = (core->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (core->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  name_00._M_len = (size_t)peVar1;
  make_filter((FilterTypes)this,(Core *)CONCAT44(in_register_00000034,type),name_00);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (__uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true>)
         (__uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Filter> make_filter(FilterTypes type, CoreApp& core, std::string_view name)
{
    return make_filter(type, core.getCopyofCorePointer().get(), name);
}